

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa.c
# Opt level: O0

int mbedtls_ecdsa_verify_restartable
              (mbedtls_ecp_group *grp,uchar *buf,size_t blen,mbedtls_ecp_point *Q,mbedtls_mpi *r,
              mbedtls_mpi *s,mbedtls_ecdsa_restart_ctx *rs_ctx)

{
  short *X;
  short *X_00;
  int iVar1;
  mbedtls_mpi *pu2;
  mbedtls_mpi *pu1;
  mbedtls_ecp_point R;
  mbedtls_mpi u2;
  mbedtls_mpi u1;
  mbedtls_mpi s_inv;
  mbedtls_mpi e;
  int ret;
  mbedtls_mpi *s_local;
  mbedtls_mpi *r_local;
  mbedtls_ecp_point *Q_local;
  size_t blen_local;
  uchar *buf_local;
  mbedtls_ecp_group *grp_local;
  
  X = &u2.s;
  X_00 = &R.Z.s;
  mbedtls_ecp_point_init((mbedtls_ecp_point *)&pu1);
  mbedtls_mpi_init((mbedtls_mpi *)&s_inv.s);
  mbedtls_mpi_init((mbedtls_mpi *)&u1.s);
  mbedtls_mpi_init((mbedtls_mpi *)&u2.s);
  mbedtls_mpi_init((mbedtls_mpi *)&R.Z.s);
  iVar1 = mbedtls_ecdsa_can_do(grp->id);
  if ((iVar1 == 0) || ((grp->N).p == (mbedtls_mpi_uint *)0x0)) {
    grp_local._4_4_ = -0x4f80;
  }
  else {
    iVar1 = mbedtls_mpi_cmp_int(r,1);
    if ((((iVar1 < 0) || (iVar1 = mbedtls_mpi_cmp_mpi(r,&grp->N), -1 < iVar1)) ||
        (iVar1 = mbedtls_mpi_cmp_int(s,1), iVar1 < 0)) ||
       (iVar1 = mbedtls_mpi_cmp_mpi(s,&grp->N), -1 < iVar1)) {
      e._12_4_ = 0xffffb200;
    }
    else {
      e._12_4_ = derive_mpi(grp,(mbedtls_mpi *)&s_inv.s,buf,blen);
      if (((((e._12_4_ == 0) &&
            (e._12_4_ = mbedtls_mpi_inv_mod((mbedtls_mpi *)&u1.s,s,&grp->N), e._12_4_ == 0)) &&
           ((e._12_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)X,(mbedtls_mpi *)&s_inv.s,
                                            (mbedtls_mpi *)&u1.s), e._12_4_ == 0 &&
            ((e._12_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)X,(mbedtls_mpi *)X,&grp->N),
             e._12_4_ == 0 &&
             (e._12_4_ = mbedtls_mpi_mul_mpi((mbedtls_mpi *)X_00,r,(mbedtls_mpi *)&u1.s),
             e._12_4_ == 0)))))) &&
          (e._12_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)X_00,(mbedtls_mpi *)X_00,&grp->N),
          e._12_4_ == 0)) &&
         (e._12_4_ = mbedtls_ecp_muladd_restartable
                               (grp,(mbedtls_ecp_point *)&pu1,(mbedtls_mpi *)X,&grp->G,
                                (mbedtls_mpi *)X_00,Q,(mbedtls_ecp_restart_ctx *)0x0), e._12_4_ == 0
         )) {
        iVar1 = mbedtls_ecp_is_zero((mbedtls_ecp_point *)&pu1);
        if (iVar1 == 0) {
          e._12_4_ = mbedtls_mpi_mod_mpi((mbedtls_mpi *)&pu1,(mbedtls_mpi *)&pu1,&grp->N);
          if ((e._12_4_ == 0) && (iVar1 = mbedtls_mpi_cmp_mpi((mbedtls_mpi *)&pu1,r), iVar1 != 0)) {
            e._12_4_ = 0xffffb200;
          }
        }
        else {
          e._12_4_ = 0xffffb200;
        }
      }
    }
    mbedtls_ecp_point_free((mbedtls_ecp_point *)&pu1);
    mbedtls_mpi_free((mbedtls_mpi *)&s_inv.s);
    mbedtls_mpi_free((mbedtls_mpi *)&u1.s);
    mbedtls_mpi_free((mbedtls_mpi *)&u2.s);
    mbedtls_mpi_free((mbedtls_mpi *)&R.Z.s);
    grp_local._4_4_ = e._12_4_;
  }
  return grp_local._4_4_;
}

Assistant:

int mbedtls_ecdsa_verify_restartable(mbedtls_ecp_group *grp,
                                     const unsigned char *buf, size_t blen,
                                     const mbedtls_ecp_point *Q,
                                     const mbedtls_mpi *r,
                                     const mbedtls_mpi *s,
                                     mbedtls_ecdsa_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_mpi e, s_inv, u1, u2;
    mbedtls_ecp_point R;
    mbedtls_mpi *pu1 = &u1, *pu2 = &u2;

    mbedtls_ecp_point_init(&R);
    mbedtls_mpi_init(&e); mbedtls_mpi_init(&s_inv);
    mbedtls_mpi_init(&u1); mbedtls_mpi_init(&u2);

    /* Fail cleanly on curves such as Curve25519 that can't be used for ECDSA */
    if (!mbedtls_ecdsa_can_do(grp->id) || grp->N.p == NULL) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    ECDSA_RS_ENTER(ver);

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && rs_ctx->ver != NULL) {
        /* redirect to our context */
        pu1 = &rs_ctx->ver->u1;
        pu2 = &rs_ctx->ver->u2;

        /* jump to current step */
        if (rs_ctx->ver->state == ecdsa_ver_muladd) {
            goto muladd;
        }
    }
#endif /* MBEDTLS_ECP_RESTARTABLE */

    /*
     * Step 1: make sure r and s are in range 1..n-1
     */
    if (mbedtls_mpi_cmp_int(r, 1) < 0 || mbedtls_mpi_cmp_mpi(r, &grp->N) >= 0 ||
        mbedtls_mpi_cmp_int(s, 1) < 0 || mbedtls_mpi_cmp_mpi(s, &grp->N) >= 0) {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Step 3: derive MPI from hashed message
     */
    MBEDTLS_MPI_CHK(derive_mpi(grp, &e, buf, blen));

    /*
     * Step 4: u1 = e / s mod n, u2 = r / s mod n
     */
    ECDSA_BUDGET(MBEDTLS_ECP_OPS_CHK + MBEDTLS_ECP_OPS_INV + 2);

    MBEDTLS_MPI_CHK(mbedtls_mpi_inv_mod(&s_inv, s, &grp->N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(pu1, &e, &s_inv));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(pu1, pu1, &grp->N));

    MBEDTLS_MPI_CHK(mbedtls_mpi_mul_mpi(pu2, r, &s_inv));
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(pu2, pu2, &grp->N));

#if defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && rs_ctx->ver != NULL) {
        rs_ctx->ver->state = ecdsa_ver_muladd;
    }

muladd:
#endif
    /*
     * Step 5: R = u1 G + u2 Q
     */
    MBEDTLS_MPI_CHK(mbedtls_ecp_muladd_restartable(grp,
                                                   &R, pu1, &grp->G, pu2, Q, ECDSA_RS_ECP));

    if (mbedtls_ecp_is_zero(&R)) {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

    /*
     * Step 6: convert xR to an integer (no-op)
     * Step 7: reduce xR mod n (gives v)
     */
    MBEDTLS_MPI_CHK(mbedtls_mpi_mod_mpi(&R.X, &R.X, &grp->N));

    /*
     * Step 8: check if v (that is, R.X) is equal to r
     */
    if (mbedtls_mpi_cmp_mpi(&R.X, r) != 0) {
        ret = MBEDTLS_ERR_ECP_VERIFY_FAILED;
        goto cleanup;
    }

cleanup:
    mbedtls_ecp_point_free(&R);
    mbedtls_mpi_free(&e); mbedtls_mpi_free(&s_inv);
    mbedtls_mpi_free(&u1); mbedtls_mpi_free(&u2);

    ECDSA_RS_LEAVE(ver);

    return ret;
}